

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::Value::~Value(Value *this)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  CommentInfo *pCVar1;
  void *__ptr;
  byte bVar2;
  long lVar3;
  
  bVar2 = (byte)*(ushort *)&this->field_0x8;
  if (bVar2 - 6 < 2) {
    this_00 = &((this->value_).map_)->_M_t;
    if (this_00 !=
        (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         *)0x0) {
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00);
  }
  else if ((bVar2 == 4) && ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0)) {
    free((this->value_).string_);
  }
  pCVar1 = this->comments_;
  if (pCVar1 != (CommentInfo *)0x0) {
    if (pCVar1[-1].comment_ != (char *)0x0) {
      lVar3 = (long)pCVar1[-1].comment_ << 3;
      do {
        __ptr = *(void **)((long)&pCVar1[-1].comment_ + lVar3);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar3 = lVar3 + -8;
      } while (lVar3 != 0);
    }
    operator_delete__(pCVar1 + -1);
    return;
  }
  return;
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releaseStringValue(value_.string_);
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
#else
  case arrayValue:
    arrayAllocator()->destructArray(value_.array_);
    break;
  case objectValue:
    mapAllocator()->destructMap(value_.map_);
    break;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  if (comments_)
    delete[] comments_;
}